

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<TestType,false,std::allocator<unsigned_long>>::
View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<TestType,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,pointer data,CoordinateOrder *externalCoordinateOrder,
          CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  allocator<unsigned_long> local_49;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  CoordinateOrder *local_38;
  CoordinateOrder *internalCoordinateOrder_local;
  CoordinateOrder *externalCoordinateOrder_local;
  pointer data_local;
  View<TestType,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  *(pointer *)this = data;
  local_48._M_current = end._M_current;
  local_40._M_current = begin._M_current;
  local_38 = internalCoordinateOrder;
  internalCoordinateOrder_local = externalCoordinateOrder;
  externalCoordinateOrder_local = (CoordinateOrder *)data;
  data_local = (pointer)this;
  this_local = (View<TestType,_false,_std::allocator<unsigned_long>_> *)end._M_current;
  end_local = begin;
  std::allocator<unsigned_long>::allocator<TestType>(&local_49,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(this + 8),local_40,local_48,
             externalCoordinateOrder,internalCoordinateOrder,&local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    ShapeIterator begin,
    ShapeIterator end,
    pointer data,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
) 
:   data_(data),
    geometry_(begin, end, externalCoordinateOrder, 
        internalCoordinateOrder, allocator)
{
    testInvariant();
}